

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O2

void csp_sha1_init(csp_sha1_state_t *sha1)

{
  sha1->state[0] = 0x67452301;
  sha1->state[1] = 0xefcdab89;
  sha1->state[2] = 0x98badcfe;
  sha1->state[3] = 0x10325476;
  *(undefined8 *)(sha1->state + 4) = 0xc3d2e1f0;
  sha1->length = 0;
  return;
}

Assistant:

void csp_sha1_init(csp_sha1_state_t * sha1) {

	sha1->state[0] = 0x67452301UL;
	sha1->state[1] = 0xefcdab89UL;
	sha1->state[2] = 0x98badcfeUL;
	sha1->state[3] = 0x10325476UL;
	sha1->state[4] = 0xc3d2e1f0UL;
	sha1->curlen = 0;
	sha1->length = 0;
}